

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Value * __thiscall
kj::_::NullableValue<kj::_::Debug::Context::Value>::emplace<kj::_::Debug::Context::Value>
          (NullableValue<kj::_::Debug::Context::Value> *this,Value *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    Array<char>::~Array(&(this->field_1).value.description.content);
  }
  (this->field_1).value.line = params->line;
  (this->field_1).value.file = params->file;
  (this->field_1).value.description.content.ptr = (params->description).content.ptr;
  (this->field_1).value.description.content.size_ = (params->description).content.size_;
  (this->field_1).value.description.content.disposer = (params->description).content.disposer;
  (params->description).content.ptr = (char *)0x0;
  (params->description).content.size_ = 0;
  this->isSet = true;
  return (Value *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }